

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2Impl::makeFCDAndAppend
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool doMakeFCD,UnicodeString *safeMiddle,
          ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UErrorCode UVar1;
  UChar *pUVar2;
  UChar *text;
  int32_t textLength;
  UnicodeString middle;
  ConstChar16Ptr local_90;
  UChar *local_88;
  UChar *local_80;
  UnicodeString local_70;
  
  if (buffer->start != buffer->limit) {
    pUVar2 = findNextFCDBoundary(this,src,limit);
    if ((long)pUVar2 - (long)src != 0) {
      local_88 = pUVar2;
      text = findPreviousFCDBoundary(this,buffer->start,buffer->limit);
      textLength = (int32_t)((ulong)((long)buffer->limit - (long)text) >> 1);
      UnicodeString::UnicodeString(&local_70,text,textLength);
      ReorderingBuffer::removeSuffix(buffer,textLength);
      UnicodeString::operator=(safeMiddle,&local_70);
      local_90.p_ = src;
      UnicodeString::append(&local_70,&local_90,(int32_t)((ulong)((long)pUVar2 - (long)src) >> 1));
      local_80 = local_90.p_;
      if ((local_70.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
        if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_70.fUnion.fFields.fArray = local_70.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        local_70.fUnion.fFields.fArray = (char16_t *)0x0;
      }
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      makeFCD(this,local_70.fUnion.fFields.fArray,
              (char16_t *)
              ((long)local_70.fUnion.fFields.fArray + (long)local_70.fUnion.fFields.fLength * 2),
              buffer,errorCode);
      UVar1 = *errorCode;
      UnicodeString::~UnicodeString(&local_70);
      src = local_88;
      if (U_ZERO_ERROR < UVar1) {
        return;
      }
    }
  }
  if (doMakeFCD == '\0') {
    if (limit == (UChar *)0x0) {
      limit = u_strchr_63(src,L'\0');
    }
    ReorderingBuffer::appendZeroCC(buffer,src,limit,errorCode);
  }
  else {
    makeFCD(this,src,limit,buffer,errorCode);
  }
  return;
}

Assistant:

void Normalizer2Impl::makeFCDAndAppend(const UChar *src, const UChar *limit,
                                       UBool doMakeFCD,
                                       UnicodeString &safeMiddle,
                                       ReorderingBuffer &buffer,
                                       UErrorCode &errorCode) const {
    if(!buffer.isEmpty()) {
        const UChar *firstBoundaryInSrc=findNextFCDBoundary(src, limit);
        if(src!=firstBoundaryInSrc) {
            const UChar *lastBoundaryInDest=findPreviousFCDBoundary(buffer.getStart(),
                                                                    buffer.getLimit());
            int32_t destSuffixLength=(int32_t)(buffer.getLimit()-lastBoundaryInDest);
            UnicodeString middle(lastBoundaryInDest, destSuffixLength);
            buffer.removeSuffix(destSuffixLength);
            safeMiddle=middle;
            middle.append(src, (int32_t)(firstBoundaryInSrc-src));
            const UChar *middleStart=middle.getBuffer();
            makeFCD(middleStart, middleStart+middle.length(), &buffer, errorCode);
            if(U_FAILURE(errorCode)) {
                return;
            }
            src=firstBoundaryInSrc;
        }
    }
    if(doMakeFCD) {
        makeFCD(src, limit, &buffer, errorCode);
    } else {
        if(limit==NULL) {  // appendZeroCC() needs limit!=NULL
            limit=u_strchr(src, 0);
        }
        buffer.appendZeroCC(src, limit, errorCode);
    }
}